

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateExport.cpp
# Opt level: O1

HelicsBool helicsFederateGetFlagOption(HelicsFederate fed,int flag,HelicsError *err)

{
  uint uVar1;
  Federate *pFVar2;
  
  pFVar2 = getFed(fed,err);
  uVar1 = 0;
  if (pFVar2 != (Federate *)0x0) {
    uVar1 = (*pFVar2->_vptr_Federate[8])(pFVar2,flag);
    uVar1 = uVar1 & 0xff;
  }
  return uVar1;
}

Assistant:

HelicsBool helicsFederateGetFlagOption(HelicsFederate fed, int flag, HelicsError* err)
{
    auto* fedObj = getFed(fed, err);
    if (fedObj == nullptr) {
        return HELICS_FALSE;
    }
    try {
        const bool res = fedObj->getFlagOption(flag);
        return (res) ? HELICS_TRUE : HELICS_FALSE;
    }
    // LCOV_EXCL_START
    catch (...) {
        helicsErrorHandler(err);
        return HELICS_FALSE;
    }
    // LCOV_EXCL_STOP
}